

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_rd.h
# Opt level: O1

void model_rd_for_sb_with_curvfit
               (AV1_COMP *cpi,BLOCK_SIZE bsize,MACROBLOCK *x,MACROBLOCKD *xd,int plane_from,
               int plane_to,int *out_rate_sum,int64_t *out_dist_sum,uint8_t *skip_txfm_sb,
               int64_t *skip_sse_sb,int *plane_rate,int64_t *plane_sse,int64_t *plane_dist)

{
  char cVar1;
  BLOCK_SIZE bsize_00;
  int iVar2;
  long lVar3;
  int64_t iVar4;
  byte bVar5;
  int iVar6;
  uint bh;
  uint bw;
  long lVar7;
  int64_t iVar8;
  macroblockd_plane *pd;
  undefined7 in_register_00000031;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined4 in_register_0000008c;
  macroblock_plane *p;
  long lVar12;
  int block_width;
  int block_height;
  long lVar13;
  double dVar14;
  double dVar15;
  double sse_norm;
  double dist_by_sse_norm_f;
  double rate_f;
  double local_40;
  double local_38;
  
  lVar9 = CONCAT71(in_register_00000031,bsize);
  iVar6 = (int)xd;
  if (plane_from < iVar6) {
    lVar12 = 0;
    lVar10 = 0;
    lVar11 = 0;
  }
  else {
    cVar1 = *(char *)(*(long *)(x->e_mbd).plane[2].seg_qmatrix[5][8] + 0x10);
    lVar3 = (long)iVar6;
    pd = (macroblockd_plane *)((long)x->plane + lVar3 * 0xa30 + 0x10);
    p = (macroblock_plane *)(lVar3 * 0x88 + lVar9);
    lVar13 = 0;
    lVar11 = 0;
    lVar10 = 0;
    lVar12 = 0;
    do {
      if ((-lVar3 != lVar13) && (*(char *)((long)&x->plane[0].dqcoeff + 4) != '\x01')) break;
      bsize_00 = av1_ss_size_lookup[(ulong)cpi & 0xff][pd->subsampling_x][pd->subsampling_y];
      bh = (uint)block_size_high[bsize_00];
      iVar2 = *(int *)((x->e_mbd).plane[2].seg_qmatrix[5] + 0x11);
      if ((iVar2 < 0) &&
         (bh = (iVar2 >> ((char)pd->subsampling_y + 3U & 0x1f)) + (uint)block_size_high[bsize_00],
         (int)bh < 1)) {
        bh = 0;
      }
      bw = (uint)block_size_wide[bsize_00];
      iVar2 = *(int *)((x->e_mbd).plane[2].seg_qmatrix[5] + 0x10);
      if ((iVar2 < 0) &&
         (bw = (iVar2 >> ((char)pd->subsampling_x + 3U & 0x1f)) + (uint)block_size_wide[bsize_00],
         (int)bw < 1)) {
        bw = 0;
      }
      iVar4 = calculate_sse((MACROBLOCKD *)x,p,pd,bw,bh);
      bVar5 = 3;
      if ((*(byte *)(*(long *)(lVar9 + 0x20b8) + 0xc0) & 8) != 0) {
        bVar5 = (char)*(undefined4 *)(lVar9 + 0x2b40) - 5;
      }
      if (iVar4 == 0) {
        iVar2 = 0;
        lVar7 = 0;
      }
      else {
        iVar2 = (int)p->dequant_QTX[1] >> (bVar5 & 0x1f);
        if (iVar2 < 2) {
          iVar2 = 1;
        }
        dVar14 = (double)(int)(bw * bh);
        sse_norm = (double)iVar4 / dVar14;
        dVar15 = log2(sse_norm / ((double)iVar2 * (double)iVar2));
        av1_model_rd_curvfit(bsize_00,sse_norm,dVar15,&local_38,&local_40);
        dVar15 = 0.0;
        if (0.0 <= local_38 * dVar14) {
          dVar15 = local_38 * dVar14;
        }
        iVar2 = (int)(dVar15 + 0.5);
        if (iVar2 == 0) {
          iVar2 = 0;
          lVar7 = iVar4 << 4;
        }
        else {
          dVar14 = sse_norm * local_40 * dVar14;
          dVar15 = 0.0;
          if (0.0 <= dVar14) {
            dVar15 = dVar14;
          }
          lVar7 = (long)(dVar15 + 0.5);
          if (iVar4 * 0x800 <=
              lVar7 * 0x80 + ((long)*(int *)(lVar9 + 0x4218) * (long)iVar2 + 0x100 >> 9)) {
            iVar2 = 0;
            lVar7 = iVar4 << 4;
          }
        }
      }
      if (-lVar3 == lVar13) {
        iVar8 = 0xffffffff;
        if (iVar4 < 0xffffffff) {
          iVar8 = iVar4;
        }
        *(int *)(lVar9 + 0x25660 + (long)cVar1 * 4) = (int)iVar8;
      }
      if (skip_sse_sb != (int64_t *)0x0) {
        *(int *)((long)skip_sse_sb + lVar13 * 4 + lVar3 * 4) = iVar2;
      }
      if (plane_rate != (int *)0x0) {
        *(int64_t *)(plane_rate + lVar3 * 2 + lVar13 * 2) = iVar4;
      }
      if (plane_sse != (int64_t *)0x0) {
        plane_sse[lVar3 + lVar13] = lVar7;
      }
      lVar12 = lVar12 + iVar4;
      lVar11 = lVar11 + iVar2;
      lVar10 = lVar10 + lVar7;
      lVar13 = lVar13 + 1;
      pd = pd + 1;
      p = p + 1;
    } while ((plane_from - iVar6) + 1 != (int)lVar13);
    lVar12 = lVar12 << 4;
  }
  if (out_dist_sum != (int64_t *)0x0) {
    *(bool *)out_dist_sum = lVar11 == 0;
  }
  if (skip_txfm_sb != (uint8_t *)0x0) {
    *(long *)skip_txfm_sb = lVar12;
  }
  *(int *)CONCAT44(in_register_0000008c,plane_to) = (int)lVar11;
  *(long *)out_rate_sum = lVar10;
  return;
}

Assistant:

static inline void model_rd_for_sb_with_curvfit(
    const AV1_COMP *const cpi, BLOCK_SIZE bsize, MACROBLOCK *x, MACROBLOCKD *xd,
    int plane_from, int plane_to, int *out_rate_sum, int64_t *out_dist_sum,
    uint8_t *skip_txfm_sb, int64_t *skip_sse_sb, int *plane_rate,
    int64_t *plane_sse, int64_t *plane_dist) {
  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  const int ref = xd->mi[0]->ref_frame[0];

  int64_t rate_sum = 0;
  int64_t dist_sum = 0;
  int64_t total_sse = 0;

  for (int plane = plane_from; plane <= plane_to; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    int64_t dist, sse;
    int rate;
    int bw, bh;
    const struct macroblock_plane *const p = &x->plane[plane];
    get_txb_dimensions(xd, plane, plane_bsize, 0, 0, plane_bsize, NULL, NULL,
                       &bw, &bh);

    sse = calculate_sse(xd, p, pd, bw, bh);
    model_rd_with_curvfit(cpi, x, plane_bsize, plane, sse, bw * bh, &rate,
                          &dist);

    if (plane == 0) x->pred_sse[ref] = (unsigned int)AOMMIN(sse, UINT_MAX);

    total_sse += sse;
    rate_sum += rate;
    dist_sum += dist;

    if (plane_rate) plane_rate[plane] = rate;
    if (plane_sse) plane_sse[plane] = sse;
    if (plane_dist) plane_dist[plane] = dist;
  }

  if (skip_txfm_sb) *skip_txfm_sb = rate_sum == 0;
  if (skip_sse_sb) *skip_sse_sb = total_sse << 4;
  *out_rate_sum = (int)rate_sum;
  *out_dist_sum = dist_sum;
}